

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<cm::optional<VerbosityEnum>_> * __thiscall
cmJSONHelperBuilder::
Optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum,bool(*)(cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum&,Json::Value_const*,cmJSONState*)>
          (cmJSONHelper<cm::optional<VerbosityEnum>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,_func_bool_VerbosityEnum_ptr_Value_ptr_cmJSONState_ptr *func)

{
  anon_class_8_1_898bcfc2 local_20;
  cmJSONHelperBuilder *local_18;
  _func_bool_VerbosityEnum_ptr_Value_ptr_cmJSONState_ptr *func_local;
  
  local_20.func = (_func_bool_VerbosityEnum_ptr_Value_ptr_cmJSONState_ptr *)this;
  local_18 = this;
  func_local = (_func_bool_VerbosityEnum_ptr_Value_ptr_cmJSONState_ptr *)__return_storage_ptr__;
  std::
  function<bool(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum>&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum,bool(*)(cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum&,Json::Value_const*,cmJSONState*)>(bool(*)(cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum&,Json::Value_const*,cmJSONState*))::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum>&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions::VerbosityEnum>&,Json::Value_const*,cmJSONState*)>
              *)__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>> Optional(F func)
  {
    return [func](cm::optional<T>& out, const Json::Value* value,
                  cmJSONState* state) -> bool {
      if (!value) {
        out.reset();
        return true;
      }
      out.emplace();
      return func(*out, value, state);
    };
  }